

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_scalevalues(int *idata,long tilelen,double scale,double zero,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  double zero_local;
  double scale_local;
  long tilelen_local;
  int *idata_local;
  
  for (ii = 0; ii < tilelen; ii = ii + 1) {
    dVar1 = ((double)idata[ii] - zero) / scale;
    if (-2147483648.49 <= dVar1) {
      if (dVar1 <= 2147483647.49) {
        if (dVar1 < 0.0) {
          idata[ii] = (int)(dVar1 - 0.5);
        }
        else {
          idata[ii] = (int)(dVar1 + 0.5);
        }
      }
      else {
        *status = -0xb;
        idata[ii] = 0x7fffffff;
      }
    }
    else {
      *status = -0xb;
      idata[ii] = -0x80000000;
    }
  }
  return *status;
}

Assistant:

int imcomp_scalevalues(
     int *idata, 
     long tilelen,
     double scale,
     double zero,
     int *status)
/*
   do inverse scaling the integer values.
*/
{
    long ii;
    double dvalue;
    
    for (ii=0; ii < tilelen; ii++)
    {
            dvalue = (idata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
    }
    return(*status);
}